

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O0

char * inet_ntop4(uchar *src,char *dst,size_t size)

{
  size_t sVar1;
  int *piVar2;
  size_t len;
  char tmp [16];
  size_t size_local;
  char *dst_local;
  uchar *src_local;
  
  len._0_1_ = 0;
  tmp._8_8_ = size;
  curl_msnprintf((char *)&len,0x10,"%d.%d.%d.%d",(ulong)*src,(ulong)src[1],(ulong)src[2],
                 (uint)src[3]);
  sVar1 = strlen((char *)&len);
  if ((sVar1 == 0) || ((ulong)tmp._8_8_ <= sVar1)) {
    piVar2 = __errno_location();
    *piVar2 = 0x1c;
    src_local = (uchar *)0x0;
  }
  else {
    strcpy(dst,(char *)&len);
    src_local = (uchar *)dst;
  }
  return (char *)src_local;
}

Assistant:

static char *inet_ntop4 (const unsigned char *src, char *dst, size_t size)
{
  char tmp[sizeof("255.255.255.255")];
  size_t len;

  DEBUGASSERT(size >= 16);

  tmp[0] = '\0';
  (void)snprintf(tmp, sizeof(tmp), "%d.%d.%d.%d",
                 ((int)((unsigned char)src[0])) & 0xff,
                 ((int)((unsigned char)src[1])) & 0xff,
                 ((int)((unsigned char)src[2])) & 0xff,
                 ((int)((unsigned char)src[3])) & 0xff);

  len = strlen(tmp);
  if(len == 0 || len >= size) {
    errno = ENOSPC;
    return (NULL);
  }
  strcpy(dst, tmp);
  return dst;
}